

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O2

void Imf_3_2::RgbaYca::decimateChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  Rgba *pRVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  bVar2 = false;
  for (; uVar4 * 8 != uVar3; uVar3 = uVar3 + 8) {
    pRVar1 = ycaIn[0xd];
    if (!bVar2) {
      Imath_3_2::half::operator=
                ((half *)((long)&(ycaOut->r)._h + uVar3),
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x1a]->r)._h + uVar3) * 4) * 0.001064 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x18]->r)._h + uVar3) * 4) * -0.003771 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x16]->r)._h + uVar3) * 4) * 0.009801 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x14]->r)._h + uVar3) * 4) * -0.021586 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x12]->r)._h + uVar3) * 4) * 0.043978 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x10]->r)._h + uVar3) * 4) * -0.093067 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0xe]->r)._h + uVar3) * 4) * 0.313659 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(pRVar1->r)._h + uVar3) * 4) * 0.499846 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0xc]->r)._h + uVar3) * 4) * 0.313659 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[10]->r)._h + uVar3) * 4) * -0.093067 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[8]->r)._h + uVar3) * 4) * 0.043978 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[6]->r)._h + uVar3) * 4) * -0.021586 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[4]->r)._h + uVar3) * 4) * 0.009801 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&((*ycaIn)->r)._h + uVar3) * 4) * 0.001064 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[2]->r)._h + uVar3) * 4) * -0.003771);
      Imath_3_2::half::operator=
                ((half *)((long)&(ycaOut->b)._h + uVar3),
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x1a]->b)._h + uVar3) * 4) * 0.001064 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x18]->b)._h + uVar3) * 4) * -0.003771 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x16]->b)._h + uVar3) * 4) * 0.009801 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x14]->b)._h + uVar3) * 4) * -0.021586 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x12]->b)._h + uVar3) * 4) * 0.043978 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0x10]->b)._h + uVar3) * 4) * -0.093067 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0xe]->b)._h + uVar3) * 4) * 0.313659 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0xd]->b)._h + uVar3) * 4) * 0.499846 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[0xc]->b)._h + uVar3) * 4) * 0.313659 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[10]->b)._h + uVar3) * 4) * -0.093067 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[8]->b)._h + uVar3) * 4) * 0.043978 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[6]->b)._h + uVar3) * 4) * -0.021586 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[4]->b)._h + uVar3) * 4) * 0.009801 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&((*ycaIn)->b)._h + uVar3) * 4) * 0.001064 +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)&(ycaIn[2]->b)._h + uVar3) * 4) * -0.003771);
      pRVar1 = ycaIn[0xd];
    }
    *(undefined2 *)((long)&(ycaOut->g)._h + uVar3) = *(undefined2 *)((long)&(pRVar1->g)._h + uVar3);
    *(undefined2 *)((long)&(ycaOut->a)._h + uVar3) = *(undefined2 *)((long)&(pRVar1->a)._h + uVar3);
    bVar2 = (bool)(bVar2 ^ 1);
  }
  return;
}

Assistant:

void
decimateChromaVert (int n, const Rgba* const ycaIn[N], Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        if ((i & 1) == 0)
        {
            ycaOut[i].r =
                ycaIn[0][i].r * 0.001064f + ycaIn[2][i].r * -0.003771f +
                ycaIn[4][i].r * 0.009801f + ycaIn[6][i].r * -0.021586f +
                ycaIn[8][i].r * 0.043978f + ycaIn[10][i].r * -0.093067f +
                ycaIn[12][i].r * 0.313659f + ycaIn[13][i].r * 0.499846f +
                ycaIn[14][i].r * 0.313659f + ycaIn[16][i].r * -0.093067f +
                ycaIn[18][i].r * 0.043978f + ycaIn[20][i].r * -0.021586f +
                ycaIn[22][i].r * 0.009801f + ycaIn[24][i].r * -0.003771f +
                ycaIn[26][i].r * 0.001064f;

            ycaOut[i].b =
                ycaIn[0][i].b * 0.001064f + ycaIn[2][i].b * -0.003771f +
                ycaIn[4][i].b * 0.009801f + ycaIn[6][i].b * -0.021586f +
                ycaIn[8][i].b * 0.043978f + ycaIn[10][i].b * -0.093067f +
                ycaIn[12][i].b * 0.313659f + ycaIn[13][i].b * 0.499846f +
                ycaIn[14][i].b * 0.313659f + ycaIn[16][i].b * -0.093067f +
                ycaIn[18][i].b * 0.043978f + ycaIn[20][i].b * -0.021586f +
                ycaIn[22][i].b * 0.009801f + ycaIn[24][i].b * -0.003771f +
                ycaIn[26][i].b * 0.001064f;
        }

        ycaOut[i].g = ycaIn[13][i].g;
        ycaOut[i].a = ycaIn[13][i].a;
    }
}